

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void __thiscall
CustomUintFormatter<2,true>::
Ser<ParamsStream<ParamsStream<DataStream&,CAddress::SerParams>&,CNetAddr::SerParams>,unsigned_short>
          (CustomUintFormatter<2,true> *this,
          ParamsStream<ParamsStream<DataStream_&,_CAddress::SerParams>_&,_CNetAddr::SerParams> *s,
          unsigned_short v)

{
  size_t in_RCX;
  uint6 in_register_00000012;
  long in_FS_OFFSET;
  uint64_t raw;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  raw = ((ulong)in_register_00000012 & 0xff00) << 0x18 |
        ((ulong)in_register_00000012 & 0xff) << 0x28 | ((ulong)v & 0xff00) << 0x28 |
        CONCAT62(in_register_00000012,v) << 0x38;
  ParamsStream<ParamsStream<DataStream_&,_CAddress::SerParams>_&,_CNetAddr::SerParams>::write
            (s,(int)&raw + 6,(void *)0x2,in_RCX);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream& s, I v)
    {
        if (v < 0 || v > MAX) throw std::ios_base::failure("CustomUintFormatter value out of range");
        if (BigEndian) {
            uint64_t raw = htobe64_internal(v);
            s.write(AsBytes(Span{&raw, 1}).last(Bytes));
        } else {
            uint64_t raw = htole64_internal(v);
            s.write(AsBytes(Span{&raw, 1}).first(Bytes));
        }
    }